

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O0

void gimage::expandGauss<unsigned_char,unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *target,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar *puVar4;
  long *plVar5;
  uchar *puVar6;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  float fVar7;
  long i_2;
  int in_stack_0000003c;
  long k_2;
  long i_1;
  long k_1;
  long i;
  long k;
  uchar *p;
  int d;
  long h;
  long w;
  long local_70;
  long in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image_00;
  long in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffc0;
  long lVar8;
  long in_stack_ffffffffffffffc8;
  long lVar9;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffffd0;
  int local_24;
  
  lVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
  lVar2 = lVar2 * 2;
  lVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI);
  lVar3 = lVar3 * 2;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RSI);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  for (local_24 = 0;
      iVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RDI),
      local_24 < iVar1; local_24 = local_24 + 1) {
    puVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getPtr(in_RDI,0,0,local_24);
    for (lVar9 = 0; lVar9 < 2 && lVar9 < lVar3; lVar9 = lVar9 + 1) {
      for (lVar8 = 0; lVar8 < lVar2; lVar8 = lVar8 + 1) {
        fVar7 = expandGaussPixel<unsigned_char>
                          ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)k_1,i_1,k_2,
                           in_stack_0000003c);
        *puVar4 = (uchar)(int)fVar7;
        puVar4 = puVar4 + 1;
      }
    }
    for (lVar9 = 2; lVar9 < lVar3 + -2; lVar9 = lVar9 + 1) {
      puVar6 = puVar4;
      if (0 < lVar2) {
        fVar7 = expandGaussPixel<unsigned_char>
                          ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)k_1,i_1,k_2,
                           in_stack_0000003c);
        puVar6 = puVar4 + 1;
        *puVar4 = (uchar)(int)fVar7;
      }
      puVar4 = puVar6;
      if (1 < lVar2) {
        fVar7 = expandGaussPixel<unsigned_char>
                          ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)k_1,i_1,k_2,
                           in_stack_0000003c);
        puVar4 = puVar6 + 1;
        *puVar6 = (uchar)(int)fVar7;
      }
      for (image_00 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x2;
          (long)image_00 < lVar2 + -2;
          image_00 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                     ((long)&image_00->depth + 1)) {
        fVar7 = expandGaussPixelInner<unsigned_char>
                          (image_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                           (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        *puVar4 = (uchar)(int)fVar7;
        puVar4 = puVar4 + 1;
      }
      puVar6 = puVar4;
      if (2 < lVar2) {
        fVar7 = expandGaussPixel<unsigned_char>
                          ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)k_1,i_1,k_2,
                           in_stack_0000003c);
        puVar6 = puVar4 + 1;
        *puVar4 = (uchar)(int)fVar7;
      }
      puVar4 = puVar6;
      if (3 < lVar2) {
        fVar7 = expandGaussPixel<unsigned_char>
                          ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)k_1,i_1,k_2,
                           in_stack_0000003c);
        puVar4 = puVar6 + 1;
        *puVar6 = (uchar)(int)fVar7;
      }
    }
    in_stack_ffffffffffffffa0 = 0;
    in_stack_ffffffffffffff98 = lVar3 + -2;
    plVar5 = std::max<long>((long *)&stack0xffffffffffffffa0,(long *)&stack0xffffffffffffff98);
    for (in_stack_ffffffffffffffa8 = *plVar5; in_stack_ffffffffffffffa8 < lVar3;
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
      for (local_70 = 0; local_70 < lVar2; local_70 = local_70 + 1) {
        fVar7 = expandGaussPixel<unsigned_char>
                          ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)k_1,i_1,k_2,
                           in_stack_0000003c);
        *puVar4 = (uchar)(int)fVar7;
        puVar4 = puVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void expandGauss(Image<T> &target, const Image<S> &image)
{
  const long w=2*image.getWidth();
  const long h=2*image.getHeight();

  target.setSize(w, h, image.getDepth());

  // for all color channels

  for (int d=0; d<target.getDepth(); d++)
  {
    T *p=target.getPtr(0, 0, d);
    for (long k=0; k<2 && k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }

    for (long k=2; k<h-2; k++)
    {
      if (w > 0) *p++=static_cast<T>(expandGaussPixel(image, 0, k, d));
      if (w > 1) *p++=static_cast<T>(expandGaussPixel(image, 1, k, d));

      for (long i=2; i<w-2; i++)
      {
        *p++=static_cast<T>(expandGaussPixelInner(image, i, k, d));
      }

      if (w > 2) *p++=static_cast<T>(expandGaussPixel(image, w-2, k, d));
      if (w > 3) *p++=static_cast<T>(expandGaussPixel(image, w-1, k, d));
    }

    for (long k=std::max(0l, h-2); k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }
  }
}